

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::
StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>::
visitStructCmpxchg(StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
                   *this,StructCmpxchg *curr)

{
  unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
  *this_00;
  bool bVar1;
  mapped_type *this_01;
  HeapType type_00;
  StructValues<wasm::PossibleConstantValues> *this_02;
  PCVScanner *this_03;
  bool local_61;
  Function *local_48;
  PossibleConstantValues *local_40;
  PossibleConstantValues *info;
  HeapType HStack_30;
  Index index;
  HeapType heapType;
  Type local_20;
  Type type;
  StructCmpxchg *curr_local;
  StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner> *this_local;
  
  local_20.id = (curr->ref->type).id;
  heapType.id._4_4_ = 1;
  type.id = (uintptr_t)curr;
  bVar1 = wasm::Type::operator==(&local_20,(BasicType *)((long)&heapType.id + 4));
  local_61 = true;
  if (!bVar1) {
    local_61 = wasm::Type::isNull(&local_20);
  }
  if (local_61 == false) {
    HStack_30 = wasm::Type::getHeapType(&local_20);
    info._4_4_ = *(Index *)(type.id + 0x10);
    this_00 = &this->functionSetGetInfos->
               super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
    ;
    local_48 = Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ::getFunction(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                              ).
                              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                              .
                              super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                            );
    this_01 = std::
              unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
              ::operator[](this_00,&local_48);
    type_00 = wasm::Type::getHeapType(&local_20);
    this_02 = StructValuesMap<wasm::PossibleConstantValues>::operator[](this_01,type_00);
    local_40 = StructValues<wasm::PossibleConstantValues>::operator[]
                         (this_02,(ulong)*(uint *)(type.id + 0x10));
    this_03 = self(this);
    anon_unknown_173::PCVScanner::noteRead(this_03,HStack_30,info._4_4_,local_40);
    noteExpressionOrCopy(this,*(Expression **)(type.id + 0x28),HStack_30,info._4_4_,local_40);
  }
  return;
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr) {
    auto type = curr->ref->type;
    if (type == Type::unreachable || type.isNull()) {
      return;
    }

    auto heapType = type.getHeapType();
    auto index = curr->index;
    auto& info =
      functionSetGetInfos[this->getFunction()][type.getHeapType()][curr->index];

    // A cmpxchg is like a read and conditional write.
    self().noteRead(heapType, index, info);
    noteExpressionOrCopy(curr->replacement, heapType, index, info);
  }